

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

span<const_char> __thiscall mpt::message_store::entry::data(entry *this,int part)

{
  byte *pbVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  char *end;
  size_t len;
  size_t skip;
  char *data;
  header *h;
  int part_local;
  entry *this_local;
  
  pbVar1 = (byte *)array::base(&this->super_array);
  sVar2 = array::length(&this->super_array);
  if ((sVar2 < 4) || (uVar5 = (ulong)*pbVar1 + 4, sVar2 <= uVar5)) {
    span<const_char>::span((span<const_char> *)&this_local,(char *)0x0,0);
  }
  else {
    skip = (size_t)(pbVar1 + uVar5);
    end = (char *)(sVar2 - uVar5);
    while (pcVar4 = end, -1 < part) {
      pvVar3 = memchr((void *)skip,0,(size_t)end);
      if (pvVar3 == (void *)0x0) {
        if (part != 0) {
          span<const_char>::span((span<const_char> *)&this_local,(char *)0x0,0);
          return _this_local;
        }
        break;
      }
      pcVar4 = (char *)((long)pvVar3 - skip);
      if (part == 0) break;
      pcVar4 = (char *)((long)pvVar3 - skip) + 1;
      skip = (size_t)(pcVar4 + skip);
      end = end + -(long)pcVar4;
    }
    end = pcVar4;
    span<const_char>::span((span<const_char> *)&this_local,(char *)skip,(long)end);
  }
  return _this_local;
}

Assistant:

span<const char> message_store::entry::data(int part) const
{
	header *h = static_cast<header *>(base());
	const char *data;
	size_t skip, len = length();
	
	if ((len < sizeof(*h)) || ((len <= (skip = h->from + sizeof(*h))))) {
		return span<const char>(0, 0);
	}
	data = ((char *) h) + skip;
	len -= skip;
	
	while (part >= 0) {
		const char *end;
		
		if (!(end = (const char *) memchr(data, 0, len))) {
			if (part) {
				return span<const char>(0, 0);
			}
			break;
		}
		skip = end - data;
		if (!part) {
			len = skip;
			break;
		}
		++skip;
		
		data += skip;
		len  -= skip;
	}
	return span<const char>(data, len);
}